

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerWrite(PgHdr *pPg)

{
  PgHdr *pPg_00;
  Pgno PVar1;
  long in_RDI;
  Pager *pPager;
  PgHdr *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pPg_00 = *(PgHdr **)(in_RDI + 0x28);
  if (((*(ushort *)(in_RDI + 0x34) & 4) == 0) ||
     (*(uint *)&pPg_00->pDirty < *(uint *)(in_RDI + 0x30))) {
    if (pPg_00->pgno == 0) {
      if ((uint)pPg_00[2].pPager < *(uint *)&pPg_00[2].pCache) {
        PVar1 = pagerWriteLargeSector(in_stack_00000020);
      }
      else {
        PVar1 = pager_write((PgHdr *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
    }
    else {
      PVar1 = pPg_00->pgno;
    }
  }
  else if (pPg_00[1].pgno == 0) {
    PVar1 = 0;
  }
  else {
    PVar1 = subjournalPageIfRequired(pPg_00);
  }
  return PVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}